

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

PromiseFromSignal<void_(Object::*)()>
QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(QString_const&)>
          (Object *fsender,offset_in_Object_to_subr fsignal,Object *rsender,
          offset_in_Object_to_subr rsignal)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  PromiseFromSignal<void_(Object::*)()> PVar1;
  anon_class_32_4_7ee6da17 local_70;
  offset_in_Object_to_subr local_50;
  offset_in_Object_to_subr rsignal_local;
  Object *local_40;
  Object *rsender_local;
  offset_in_Object_to_subr fsignal_local;
  Object *local_28;
  Object *fsender_local;
  offset_in_Object_to_subr local_18;
  Object *local_10;
  
  local_70.fsender = &local_28;
  local_70.fsignal = (offset_in_Object_to_subr *)&rsender_local;
  local_70.rsender = &local_40;
  local_70.rsignal = &local_50;
  rsender_local = rsender;
  fsignal_local = rsignal;
  local_28 = (Object *)fsignal;
  fsender_local = rsender;
  local_18 = rsignal;
  local_10 = fsender;
  QPromise<void>::
  QPromise<QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(QString_const&)>(Object_const*,void(Object::*)(),Object_const*,void(Object::*)(QString_const&))::_lambda(QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)_1_>
            ((QPromise<void> *)fsender,&local_70);
  PVar1.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  PVar1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)fsender;
  return (PromiseFromSignal<void_(Object::*)()>)PVar1.super_QPromiseBase<void>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<FSignal>
connect(const FSender* fsender, FSignal fsignal, const RSender* rsender, RSignal rsignal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<FSignal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, fsender, fsignal);
        connectSignalToResolver(connections, reject, rsender, rsignal);
        connectDestroyedToReject(connections, reject, fsender);
    }};
}